

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfword_data_transfer.c
# Opt level: O1

void halfword_dt_ro_cold_1(void)

{
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/halfword_data_transfer.c"
          ,0x2d);
  fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","Special case for R15: PC");
  exit(1);
}

Assistant:

INLINE void halfword_dt(arm7tdmi_t* state, bool p, bool u, bool w, bool l, byte rn, byte rd, word offset, bool s, bool h) {
    unimplemented(p == 0 && w == 1, "When p is 0, this bit must also always be 0!")
    if (p == 0) { w = true; } // Writeback always enabled when p == 0
    unimplemented(s == 0 && h == 0, "This is actually a SWP instruction, something went wrong and execution shouldn't be here")

    word addr = get_register(state, rn);
    if (p) {
        if (u) {
            addr += offset;
        } else {
            addr -= offset;
        }
    }

    if (l) {
        if (!s && h) { // LDRH: Load unsigned halfword (zero extended)
            half value = state->read_half(addr, ACCESS_NONSEQUENTIAL);
            set_register(state, rd, rotate_right(value, (addr & 1u) << 3u));
        } else if (s && !h) { //LDRSB: Load signed byte (sign extended)
            word value = state->read_byte(addr, ACCESS_NONSEQUENTIAL);
            set_register(state, rd, sign_extend_word(value, 8, 32));
        } else if (s && h) { // LDRSH: Load signed halfword (sign extended)
            word value;
            if (addr & 1) {
                value = state->read_byte(addr, ACCESS_NONSEQUENTIAL);
                value = sign_extend_word(value, 8, 32);
            } else {
                value = state->read_half(addr, ACCESS_NONSEQUENTIAL);
                value = sign_extend_word(value, 16, 32);
            }
            set_register(state, rd, value);
        }
        state->cpu_idle(1);
    } else {
        logdebug("p: %d, u: %d, w: %d, l: %d, rn: %d, rd: %d, offset: %d, s: %d, h: %d", p, u, w, l, rn, rd, offset, s, h)
        if (!s && h) { // Store halfword
            unimplemented(rd == 15, "Special case for R15: PC")
            state->write_half(addr, get_register(state, rd), ACCESS_NONSEQUENTIAL);
        } else if (s && !h) { // Load doubleword
            logfatal("ldrd unimplemented (is this caught by LDR?)")
        } else if (s && h) { // Load halfword
            logfatal("strd unimplemented (is this caught by STR?)")
        }
    }

    if (w && (!l || rd != rn)) {
        if (!p) {
            if (u) {
                addr += offset;
            } else {
                addr -= offset;
            }
        }
        set_register(state, rn, addr);
    }
}